

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O0

SQInteger debug_getlocals(HSQUIRRELVM v)

{
  int iVar1;
  SQInteger SVar2;
  HSQUIRRELVM v_00;
  SQChar *__s1;
  HSQUIRRELVM in_RDI;
  HSQUIRRELVM unaff_retaddr;
  SQInteger prevTop;
  SQInteger seq;
  SQChar *name;
  SQBool includeInternal;
  SQInteger level;
  SQBool *in_stack_ffffffffffffffc8;
  SQInteger in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQInteger in_stack_ffffffffffffffe0;
  HSQUIRRELVM v_01;
  HSQUIRRELVM v_02;
  
  v_02 = (HSQUIRRELVM)0x1;
  v_01 = (HSQUIRRELVM)0x0;
  SVar2 = sq_gettop(in_RDI);
  if (1 < SVar2) {
    sq_getinteger(v_01,in_stack_ffffffffffffffe0,(SQInteger *)in_stack_ffffffffffffffd8);
  }
  SVar2 = sq_gettop(in_RDI);
  if (2 < SVar2) {
    sq_getbool(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  sq_newtable(v_02);
  v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
  do {
    while( true ) {
      __s1 = sq_getlocal((HSQUIRRELVM)name,seq,prevTop);
      if (__s1 == (SQChar *)0x0) {
        return 1;
      }
      if (v_01 == (HSQUIRRELVM)0x0) break;
LAB_001d12b4:
      sq_pushstring(unaff_retaddr,(SQChar *)in_RDI,(SQInteger)v_02);
      sq_push(v_00,(SQInteger)in_stack_ffffffffffffffc8);
      sq_newslot((HSQUIRRELVM)prevTop,(SQInteger)unaff_retaddr,(SQBool)in_RDI);
      sq_pop(v_00,(SQInteger)in_stack_ffffffffffffffc8);
    }
    if (*__s1 != '@') {
      iVar1 = strcmp(__s1,"this");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"vargv");
        if (iVar1 != 0) goto LAB_001d12b4;
      }
    }
    sq_pop(v_00,(SQInteger)in_stack_ffffffffffffffc8);
  } while( true );
}

Assistant:

static SQInteger debug_getlocals(HSQUIRRELVM v)
{
    SQInteger level = 1;
    SQBool includeInternal = false;

    if (sq_gettop(v) >= 2)
        sq_getinteger(v, 2, &level);
    if (sq_gettop(v) >= 3)
        sq_getbool(v, 3, &includeInternal);

    sq_newtable(v);
    const SQChar *name = NULL;

    SQInteger seq=0;
    SQInteger prevTop = sq_gettop(v);
    while ((name = sq_getlocal(v, level, seq))) {
        ++seq;
        if (!includeInternal && (name[0] == '@' || strcmp(name, "this")==0 || strcmp(name, "vargv")==0)) {
            sq_pop(v, 1);
            continue;
        }

        sq_pushstring(v, name, -1);
        sq_push(v, -2);
        sq_newslot(v, -4, SQFalse);
        sq_pop(v, 1);
    }
    return 1;
}